

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O0

void __thiscall VRle::Data::opIntersect(Data *this,VRect *r,VRleSpanCb cb,void *userData)

{
  code *pcVar1;
  bool bVar2;
  size_type sVar3;
  Span *pSVar4;
  size_t sVar5;
  pointer pvVar6;
  undefined8 in_RCX;
  code *in_RDX;
  VRect *in_RSI;
  vector<VRle::Span,_std::allocator<VRle::Span>_> *in_RDI;
  size_t count;
  Result result;
  View obj;
  Data *in_stack_fffffffffffff788;
  Data *in_stack_fffffffffffff790;
  array<VRle::Span,_255UL> *in_stack_fffffffffffff7a0;
  Result *in_stack_fffffffffffff7f0;
  rle_view *in_stack_fffffffffffff7f8;
  VRect *in_stack_fffffffffffff800;
  View local_40;
  VRect local_30;
  undefined8 local_20;
  code *local_18;
  VRect *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = empty((Data *)0x121929);
  if (!bVar2) {
    local_30 = bbox(in_stack_fffffffffffff788);
    bVar2 = VRect::contains(local_10,&local_30,false);
    if (bVar2) {
      sVar3 = std::vector<VRle::Span,_std::allocator<VRle::Span>_>::size(in_RDI);
      pSVar4 = std::vector<VRle::Span,_std::allocator<VRle::Span>_>::data
                         ((vector<VRle::Span,_std::allocator<VRle::Span>_> *)0x12199b);
      (*local_18)(sVar3,pSVar4,local_20);
    }
    else {
      local_40 = view(in_stack_fffffffffffff790);
      std::array<VRle::Span,_255UL>::array(in_stack_fffffffffffff7a0);
      while (sVar5 = View::size(&local_40), sVar5 != 0) {
        sVar5 = _opIntersect(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                             in_stack_fffffffffffff7f0);
        pcVar1 = local_18;
        if (sVar5 != 0) {
          pvVar6 = std::array<VRle::Span,_255UL>::data((array<VRle::Span,_255UL> *)0x121a36);
          (*pcVar1)(sVar5,pvVar6,local_20);
        }
      }
    }
  }
  return;
}

Assistant:

void VRle::Data::opIntersect(const VRect &r, VRle::VRleSpanCb cb,
                             void *userData) const
{
    if (empty()) return;

    if (r.contains(bbox())) {
        cb(mSpans.size(), mSpans.data(), userData);
        return;
    }

    auto   obj = view();
    Result result;
    // run till all the spans are processed
    while (obj.size()) {
        auto count = _opIntersect(r, obj, result);
        if (count) cb(count, result.data(), userData);
    }
}